

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O0

archive_string_conv * get_sconv(archive_write *a,zip_conflict *zip)

{
  archive_string_conv *paVar1;
  zip_conflict *zip_local;
  archive_write *a_local;
  
  if (zip->opt_sconv == (archive_string_conv *)0x0) {
    if (zip->init_default_conversion == 0) {
      paVar1 = archive_string_default_conversion_for_write(&a->archive);
      zip->sconv_default = paVar1;
      zip->init_default_conversion = 1;
    }
    a_local = (archive_write *)zip->sconv_default;
  }
  else {
    a_local = (archive_write *)zip->opt_sconv;
  }
  return (archive_string_conv *)a_local;
}

Assistant:

static struct archive_string_conv *
get_sconv(struct archive_write *a)
{
	struct cpio *cpio;
	struct archive_string_conv *sconv;

	cpio = (struct cpio *)a->format_data;
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_write(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	return (sconv);
}